

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors_analytics_sdk.cpp
# Opt level: O3

void __thiscall sensors_analytics::Sdk::~Sdk(Sdk *this)

{
  DefaultConsumer *this_00;
  PropertiesNode *pPVar1;
  pointer ppUVar2;
  pointer pcVar3;
  
  this_00 = this->consumer_;
  if (this_00 != (DefaultConsumer *)0x0) {
    DefaultConsumer::~DefaultConsumer(this_00);
    operator_delete(this_00);
    this->consumer_ = (DefaultConsumer *)0x0;
  }
  pPVar1 = this->super_properties_;
  if (pPVar1 != (PropertiesNode *)0x0) {
    (pPVar1->super_ObjectNode)._vptr_ObjectNode = (_func_int **)&PTR_SetList_00122d10;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sensors_analytics::utils::ObjectNode::ValueNode>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sensors_analytics::utils::ObjectNode::ValueNode>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sensors_analytics::utils::ObjectNode::ValueNode>_>_>
    ::~_Rb_tree(&(pPVar1->super_ObjectNode).properties_map_._M_t);
    operator_delete(pPVar1);
    this->super_properties_ = (PropertiesNode *)0x0;
  }
  ppUVar2 = (this->observers).
            super__Vector_base<sensors_analytics::UserAlterationObserver_*,_std::allocator<sensors_analytics::UserAlterationObserver_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppUVar2 != (pointer)0x0) {
    operator_delete(ppUVar2);
  }
  pcVar3 = (this->staging_file_path_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this->staging_file_path_).field_2) {
    operator_delete(pcVar3);
  }
  pcVar3 = (this->distinct_id_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this->distinct_id_).field_2) {
    operator_delete(pcVar3);
    return;
  }
  return;
}

Assistant:

Sdk::~Sdk() {
  if (consumer_ != NULL) {
    delete consumer_;
    consumer_ = NULL;
  }
  if (super_properties_ != NULL) {
    delete super_properties_;
    super_properties_ = NULL;
  }
}